

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIButton::CGUIButton
          (CGUIButton *this,void **vtt,IGUIEnvironment *environment,IGUIElement *parent,s32 id,
          rect<int> rectangle,bool noclip)

{
  rect<int> rectangle_00;
  undefined1 *puVar1;
  IGUIElement *in_RCX;
  vector2d<int> in_RSI;
  IGUIElement *in_RDI;
  undefined8 in_stack_00000008;
  IGUIElement *in_stack_00000010;
  undefined1 noClip;
  IGUIElement *this_00;
  undefined8 in_stack_ffffffffffffff70;
  rect<int> *prVar2;
  IGUIElement *in_stack_ffffffffffffff78;
  EGUI_ALIGNMENT *pEVar3;
  IGUIEnvironment *in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff88;
  s32 index;
  undefined1 *local_40;
  
  rectangle_00.LowerRightCorner = in_RSI;
  rectangle_00.UpperLeftCorner = in_RSI;
  IGUIButton::IGUIButton
            ((IGUIButton *)in_RCX,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,(s32)((ulong)in_stack_ffffffffffffff70 >> 0x20),rectangle_00)
  ;
  (in_RDI->super_IEventReceiver)._vptr_IEventReceiver = *(_func_int ***)in_RSI;
  *(undefined8 *)
   ((in_RDI->super_IEventReceiver)._vptr_IEventReceiver[-3] +
   (long)&(in_RDI->super_IEventReceiver)._vptr_IEventReceiver) =
       *(undefined8 *)((long)in_RSI + 0x28);
  this_00 = in_stack_00000010;
  puVar1 = &in_RDI->field_0x134;
  do {
    local_40 = puVar1;
    ButtonSprite::ButtonSprite((ButtonSprite *)this_00);
    puVar1 = local_40 + 0xc;
  } while ((vector2d<int> *)(local_40 + 0xc) != &in_RDI[1].RelativeRect.LowerRightCorner);
  in_RDI[1].RelativeRect.LowerRightCorner.X = 0;
  in_RDI[1].RelativeRect.LowerRightCorner.Y = 0;
  prVar2 = &in_RDI[1].AbsoluteRect;
  pEVar3 = &in_RDI[1].AlignLeft;
  do {
    ButtonImage::ButtonImage((ButtonImage *)0x39b6c4);
    index = (s32)((ulong)local_40 >> 0x20);
    noClip = (undefined1)((ulong)in_stack_00000008 >> 0x38);
    prVar2 = (rect<int> *)&prVar2[1].LowerRightCorner;
  } while (prVar2 != (rect<int> *)pEVar3);
  in_RDI[1].AlignLeft = EGUIA_UPPERLEFT;
  in_RDI[1].AlignRight = EGUIA_UPPERLEFT;
  *(undefined1 *)&in_RDI[1].AlignTop = EGUIA_UPPERLEFT;
  video::SColor::SColor((SColor *)&in_RDI[1].AlignBottom,0x65,0xff,0xff,0xff);
  *(undefined4 *)&in_RDI[1].Environment = 0;
  *(undefined4 *)((long)&in_RDI[1].Environment + 4) = 0;
  in_RDI[1].Type = EGUIET_BUTTON;
  in_RDI[1].field_0x134 = 0;
  in_RDI[1].field_0x135 = 0;
  in_RDI[1].field_0x136 = 0;
  in_RDI[1].field_0x137 = 0;
  in_RDI[1].field_0x138 = 0;
  in_RDI[1].field_0x139 = 1;
  in_RDI[1].field_0x13a = 0;
  IGUIElement::setNotClipped(this_00,(bool)noClip);
  IGUIElement::setTabStop(in_RDI,true);
  IGUIElement::setTabOrder(in_RCX,index);
  return;
}

Assistant:

CGUIButton::CGUIButton(IGUIEnvironment *environment, IGUIElement *parent,
		s32 id, core::rect<s32> rectangle, bool noclip) :
		IGUIButton(environment, parent, id, rectangle),
		SpriteBank(0), OverrideFont(0),
		OverrideColorEnabled(false), OverrideColor(video::SColor(101, 255, 255, 255)),
		ClickTime(0), HoverTime(0), FocusTime(0),
		ClickShiftState(false), ClickControlState(false),
		IsPushButton(false), Pressed(false),
		UseAlphaChannel(false), DrawBorder(true), ScaleImage(false)
{
#ifdef _DEBUG
	setDebugName("CGUIButton");
#endif
	setNotClipped(noclip);

	// This element can be tabbed.
	setTabStop(true);
	setTabOrder(-1);
}